

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_449da5::HandleDifferentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  cmExecutionStatus *pcVar2;
  pointer __s;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  pointer pbVar8;
  pointer pcVar9;
  int iVar10;
  ulong uVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string local_88;
  pointer local_68;
  cmExecutionStatus *local_60;
  pointer local_58;
  string local_50;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
    iVar10 = 1;
    uVar11 = 1;
    uVar7 = 2;
    local_68 = (pointer)0x0;
    local_58 = (pointer)0x0;
    pcVar9 = (char *)0x0;
    local_60 = status;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar11));
      pcVar2 = local_60;
      if (iVar4 == 0) {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar10 = 2;
      }
      else {
        if (iVar10 == 3) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_58 = pbVar8[uVar11]._M_dataplus._M_p;
        }
        else {
          if (iVar10 == 2) {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pcVar9 = pbVar8[uVar11]._M_dataplus._M_p;
            iVar10 = 3;
            goto LAB_001cffe3;
          }
          if (iVar10 != 1) {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_88.field_2._8_8_ = pbVar8[uVar11]._M_dataplus._M_p;
            local_88.field_2._M_allocated_capacity = pbVar8[uVar11]._M_string_length;
            local_88._M_dataplus._M_p = (pointer)0x21;
            local_88._M_string_length = 0x68550a;
            views._M_len = 2;
            views._M_array = (iterator)&local_88;
            cmCatViews_abi_cxx11_(&local_50,views);
            std::__cxx11::string::_M_assign((string *)&local_60->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return false;
            }
            goto LAB_001d0140;
          }
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_68 = pbVar8[uVar11]._M_dataplus._M_p;
        }
        iVar10 = 0;
      }
LAB_001cffe3:
      __s = local_58;
      uVar11 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar11 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
            );
    status = local_60;
    if (local_68 != (pointer)0x0) {
      if (pcVar9 != (char *)0x0 && local_58 != (char *)0x0) {
        paVar1 = &local_88.field_2;
        local_88._M_dataplus._M_p = (pointer)paVar1;
        sVar5 = strlen(pcVar9);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar9,pcVar9 + sVar5);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
        bVar3 = cmsys::SystemTools::FilesDiffer(&local_88,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pcVar9 = local_68;
        this = pcVar2->Makefile;
        local_88._M_dataplus._M_p = (pointer)paVar1;
        sVar5 = strlen(local_68);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar9,pcVar9 + sVar5);
        pcVar6 = "0";
        if (bVar3) {
          pcVar6 = "1";
        }
        value._M_str = pcVar6;
        value._M_len = 1;
        cmMakefile::AddDefinition(this,&local_88,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"DIFFERENT not given FILES option with two file names.","");
      std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
      goto LAB_001d0132;
    }
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"DIFFERENT not given result variable name.","");
  std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001d0132:
  local_50.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_88._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_001d0140:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool HandleDifferentCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      status.SetError(cmStrCat("DIFFERENT given unknown argument ", args[i]));
      return false;
    }
  }
  if (!var) {
    status.SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    status.SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  status.GetMakefile().AddDefinition(var, result);
  return true;
}